

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_rcm(REF_EDGE ref_edge,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_NODE pRVar1;
  bool bVar2;
  uint uVar3;
  REF_INT *o2n;
  ulong uVar4;
  REF_INT *n2o;
  REF_INT *queue;
  ulong uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  REF_EDGE ref_edge_00;
  REF_STATUS RVar10;
  REF_INT nqueue;
  int local_6c;
  REF_INT ndone;
  int local_64;
  REF_EDGE local_60;
  REF_INT **local_58;
  REF_INT **local_50;
  REF_NODE local_48;
  REF_INT *local_40;
  REF_ADJ local_38;
  
  pRVar1 = ref_edge->node;
  *o2n_ptr = (REF_INT *)0x0;
  *n2o_ptr = (REF_INT *)0x0;
  uVar8 = (ulong)pRVar1->max;
  local_60 = ref_edge;
  if ((long)uVar8 < 0) {
    pcVar9 = "malloc o2n of REF_INT negative";
    uVar6 = 0x31b;
LAB_001a4fbb:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar6,
           "ref_edge_rcm",pcVar9);
LAB_001a4fc2:
    RVar10 = 1;
  }
  else {
    o2n = (REF_INT *)malloc(uVar8 * 4);
    if (o2n == (REF_INT *)0x0) {
      pcVar9 = "malloc o2n of REF_INT NULL";
      uVar6 = 0x31b;
    }
    else {
      for (uVar4 = 0; uVar4 < uVar8; uVar4 = uVar4 + 1) {
        o2n[uVar4] = -1;
      }
      uVar8 = (ulong)(uint)pRVar1->n;
      if (pRVar1->n < 0) {
        pcVar9 = "malloc n2o of REF_INT negative";
        uVar6 = 0x31c;
        goto LAB_001a4fbb;
      }
      n2o = (REF_INT *)malloc(uVar8 * 4);
      if (n2o == (REF_INT *)0x0) {
        pcVar9 = "malloc n2o of REF_INT NULL";
        uVar6 = 0x31c;
      }
      else {
        local_58 = n2o_ptr;
        local_50 = o2n_ptr;
        local_48 = pRVar1;
        queue = (REF_INT *)malloc(uVar8 * 8);
        if (queue != (REF_INT *)0x0) {
          ndone = 0;
          nqueue = 0;
          ref_edge_00 = local_60;
          local_40 = n2o;
          while( true ) {
            iVar7 = (int)uVar8;
            if (iVar7 <= ndone) break;
            local_38 = ref_edge_00->adj;
            pRVar1 = ref_edge_00->node;
            uVar8 = 0xffffffffffffffff;
            local_6c = -1;
            for (uVar4 = 0; n2o = local_40, ref_edge_00 = local_60, iVar7 = (int)uVar8,
                (long)uVar4 < (long)pRVar1->max; uVar4 = uVar4 + 1) {
              if ((-1 < pRVar1->global[uVar4]) && (o2n[uVar4] == -1)) {
                uVar3 = ref_adj_degree(local_38,(REF_INT)uVar4,&local_64);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,0x2be,"ref_edge_min_degree_node",(ulong)uVar3,"deg");
                  pcVar9 = "min degree node";
                  uVar6 = 0x324;
                  goto LAB_001a509d;
                }
                if (0 < local_64) {
                  bVar2 = local_64 < local_6c;
                  if (bVar2 || iVar7 == -1) {
                    local_6c = local_64;
                  }
                  uVar8 = uVar8 & 0xffffffff;
                  if (bVar2 || iVar7 == -1) {
                    uVar8 = uVar4 & 0xffffffff;
                  }
                }
              }
            }
            uVar3 = ref_edge_rcm_queue(local_60,iVar7,o2n,local_40,&ndone,queue,&nqueue);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar9 = "min";
              uVar6 = 0x327;
LAB_001a509d:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,uVar6,"ref_edge_rcm",uVar8,pcVar9);
              return (REF_STATUS)uVar8;
            }
            while (0 < nqueue) {
              iVar7 = nqueue * 2;
              nqueue = nqueue + -1;
              uVar3 = ref_edge_rcm_queue(ref_edge_00,queue[iVar7 - 2],o2n,n2o,&ndone,queue,&nqueue);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar9 = "min";
                uVar6 = 0x330;
                goto LAB_001a509d;
              }
            }
            uVar8 = (ulong)(uint)local_48->n;
          }
          if (ndone == iVar7) {
            uVar5 = 0;
            uVar4 = 0;
            if (0 < iVar7) {
              uVar4 = uVar8;
            }
            for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
              uVar8 = (ulong)((int)uVar8 + -1);
              queue[uVar8] = n2o[uVar5];
            }
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              n2o[uVar8] = queue[uVar8];
            }
            free(queue);
            for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
              o2n[n2o[uVar8]] = (REF_INT)uVar8;
            }
            *local_50 = o2n;
            *local_58 = n2o;
            return 0;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x334,"ref_edge_rcm","reordering done not original nodes",(long)ndone,(long)iVar7);
          goto LAB_001a4fc2;
        }
        pcVar9 = "malloc queue of REF_INT NULL";
        uVar6 = 0x31d;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar6,
           "ref_edge_rcm",pcVar9);
    RVar10 = 2;
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_edge_rcm(REF_EDGE ref_edge, REF_INT **o2n_ptr,
                                REF_INT **n2o_ptr) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *o2n, *n2o, *queue;
  REF_INT min_degree, min_degree_node;
  REF_INT ndone, nqueue, node;

  *o2n_ptr = NULL;
  *n2o_ptr = NULL;
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc(n2o, ref_node_n(ref_node), REF_INT);
  ref_malloc(queue, 2 * ref_node_n(ref_node), REF_INT);

  ndone = 0;
  nqueue = 0;

  while (ndone < ref_node_n(ref_node)) {
    RSS(ref_edge_min_degree_node(ref_edge, o2n, &min_degree, &min_degree_node),
        "min degree node");
    RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                           &nqueue),
        "min");

    /* drain queue */
    while (nqueue > 0) {
      min_degree_node = queue[0 + 2 * (nqueue - 1)];
      min_degree = queue[1 + 2 * (nqueue - 1)];
      nqueue--;
      RSS(ref_edge_rcm_queue(ref_edge, min_degree_node, o2n, n2o, &ndone, queue,
                             &nqueue),
          "min");
    }
  }

  REIS(ndone, ref_node_n(ref_node), "reordering done not original nodes");

  /* reverse with queue as temporary space */
  for (node = 0; node < ndone; node++) {
    queue[ndone - node - 1] = n2o[node];
  }
  /* copy back */
  for (node = 0; node < ndone; node++) {
    n2o[node] = queue[node];
  }
  ref_free(queue);

  /* set o2n to reverse */
  for (node = 0; node < ndone; node++) {
    o2n[n2o[node]] = node;
  }

  *o2n_ptr = o2n;
  *n2o_ptr = n2o;

  return REF_SUCCESS;
}